

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O0

typed_option<unsigned_int> * __thiscall
VW::config::typed_option<unsigned_int>::default_value(typed_option<unsigned_int> *this,uint value)

{
  typed_option<unsigned_int> *in_RDI;
  uint *in_stack_00000008;
  shared_ptr<unsigned_int> *in_stack_ffffffffffffffe0;
  
  std::make_shared<unsigned_int,unsigned_int&>(in_stack_00000008);
  std::shared_ptr<unsigned_int>::operator=
            (in_stack_ffffffffffffffe0,(shared_ptr<unsigned_int> *)in_RDI);
  std::shared_ptr<unsigned_int>::~shared_ptr((shared_ptr<unsigned_int> *)0x17f1f4);
  return in_RDI;
}

Assistant:

typed_option& default_value(T value)
  {
    m_default_value = std::make_shared<T>(value);
    return *this;
  }